

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::Petition
          (CommissionerImpl *this,PetitionHandler *aHandler,string *aAddr,uint16_t aPort)

{
  string *psVar1;
  char *pcVar2;
  int iVar3;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  *this_00;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  string_view fmt;
  format_args args;
  format_args args_00;
  Error error;
  writer write;
  anon_class_40_2_3adf01b8 onConnected;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  string local_158;
  undefined1 local_138 [8];
  undefined1 *local_130;
  char local_128 [8];
  undefined1 local_120 [16];
  string *local_110;
  ErrorCode local_108;
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  writer local_e0;
  _Any_data local_d8;
  code *local_c8;
  CommissionerImpl *local_b8;
  _Any_data local_b0;
  code *local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  local_100 = local_f0;
  local_108 = kNone;
  local_f8 = 0;
  local_f0[0] = 0;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
              *)&local_d8,aHandler);
  local_b8 = this;
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_138 = (undefined1  [8])local_128;
    local_110 = aAddr;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"meshcop","");
    local_68.types_[0] = string_type;
    local_68.types_[1] = uint_type;
    pcVar4 = "starting petition: border agent = ({}, {})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "starting petition: border agent = ({}, {})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2a;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    local_e0.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar4 == "") break;
      pcVar5 = pcVar4;
      if (*pcVar4 == '{') {
LAB_001b988e:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
        ::writer::operator()(&local_e0,pcVar4,pcVar5);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                           (pcVar5,"",&local_68);
        bVar6 = true;
      }
      else {
        pcVar5 = pcVar4 + 1;
        bVar6 = pcVar5 != "";
        if (bVar6) {
          if (*pcVar5 != '{') {
            pcVar2 = pcVar4 + 2;
            do {
              pcVar5 = pcVar2;
              bVar6 = pcVar5 != "";
              if (pcVar5 == "") goto LAB_001b988a;
              pcVar2 = pcVar5 + 1;
            } while (*pcVar5 != '{');
          }
          bVar6 = true;
        }
LAB_001b988a:
        if (bVar6) goto LAB_001b988e;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
        ::writer::operator()(&local_e0,pcVar4,"");
        bVar6 = false;
      }
    } while (bVar6);
    psVar1 = local_110;
    local_68.types_ = (type  [2])(local_110->_M_dataplus)._M_p;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)local_110->_M_string_length;
    fmt.size_ = 0x2d;
    fmt.data_ = (char *)0x2a;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = (ulong)aPort;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_158,(v10 *)"starting petition: border agent = ({}, {})",fmt,args_00);
    Log(kDebug,(string *)local_138,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138);
    }
    if ((this->mBrClient).mDtlsSession.mState == kConnected) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                  *)&local_b0,aHandler);
      SendPetition(this,(PetitionHandler *)&local_b0);
      if (local_a0 != (code *)0x0) {
        (*local_a0)(&local_b0,&local_b0,__destroy_functor);
      }
    }
    else {
      local_168 = (code *)0x0;
      pcStack_160 = (code *)0x0;
      local_178 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                   *)0x0;
      uStack_170 = 0;
      this_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                 *)operator_new(0x28);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::function(this_00,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                          *)&local_d8);
      *(CommissionerImpl **)&this_00[1].super__Function_base._M_functor = local_b8;
      pcStack_160 = std::
                    _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:267:24)>
                    ::_M_invoke;
      local_168 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:267:24)>
                  ::_M_manager;
      local_178 = this_00;
      (*(this->super_Commissioner)._vptr_Commissioner[4])(this,&local_178,psVar1,(ulong)aPort);
      if (local_168 != (code *)0x0) {
        (*local_168)(&local_178,&local_178,3);
      }
    }
  }
  else {
    local_68.types_ = (type  [2])((ulong)local_68.types_[1] << 0x20);
    pcVar4 = "cannot petition when the commissioner is running";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot petition when the commissioner is running";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x30;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_e0.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar4 == "") break;
      pcVar5 = pcVar4;
      if (*pcVar4 == '{') {
LAB_001b96ee:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&local_e0,pcVar4,pcVar5);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_68);
        bVar6 = true;
      }
      else {
        pcVar5 = pcVar4 + 1;
        bVar6 = pcVar5 != "";
        if (bVar6) {
          if (*pcVar5 != '{') {
            pcVar2 = pcVar4 + 2;
            do {
              pcVar5 = pcVar2;
              bVar6 = pcVar5 != "";
              if (pcVar5 == "") goto LAB_001b96ea;
              pcVar2 = pcVar5 + 1;
            } while (*pcVar5 != '{');
          }
          bVar6 = true;
        }
LAB_001b96ea:
        if (bVar6) goto LAB_001b96ee;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&local_e0,pcVar4,"");
        bVar6 = false;
      }
    } while (bVar6);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_158,(v10 *)"cannot petition when the commissioner is running",
               (string_view)ZEXT816(0x30),args);
    local_138._0_4_ = 0xf;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_158._M_dataplus._M_p,
               local_158._M_dataplus._M_p + local_158._M_string_length);
    local_108 = local_138._0_4_;
    std::__cxx11::string::operator=((string *)&local_100,(string *)&local_130);
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  if (local_108 != kNone) {
    local_90._0_4_ = local_108;
    local_88._M_p = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_100,local_100 + local_f8);
    local_68.types_[0] = none_type;
    local_68.types_[1] = none_type;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)
              ((_Any_data *)aHandler,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_68,
               (Error *)local_90);
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  return;
}

Assistant:

void CommissionerImpl::Petition(PetitionHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    Error error;

    auto onConnected = [&, aHandler](Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            LOG_DEBUG(LOG_REGION_MESHCOP, "DTLS connection to border agent succeed");
            this->mState = State::kConnected;
            SendPetition(aHandler);
        }
    };

    VerifyOrExit(!IsActive(), error = ERROR_INVALID_STATE("cannot petition when the commissioner is running"));
    LOG_DEBUG(LOG_REGION_MESHCOP, "starting petition: border agent = ({}, {})", aAddr, aPort);

    if (mBrClient.IsConnected())
    {
        SendPetition(aHandler);
    }
    else
    {
        Connect(onConnected, aAddr, aPort);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}